

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ijgp.h
# Opt level: O2

void __thiscall libDAI::IJGP::IJGP(IJGP *this,IJGP *x)

{
  double dVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  double dVar6;
  size_t sVar7;
  undefined4 uVar8;
  
  DAIAlg<libDAI::RegionGraph>::DAIAlg(&this->super_DAIAlgRG,&x->super_DAIAlgRG);
  (this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm =
       (_func_int **)&PTR_clone_0061eb90;
  uVar8 = *(undefined4 *)&(x->Props).field_0x4;
  dVar1 = (x->Props).tol;
  sVar2 = (x->Props).maxiter;
  sVar3 = (x->Props).verbose;
  sVar4 = (x->Props).maxiter;
  sVar5 = (x->Props).verbose;
  dVar6 = (x->Props).damping;
  sVar7 = (x->Props).i;
  (this->Props).updates = (UpdateType)(x->Props).updates.v;
  *(undefined4 *)&(this->Props).field_0x4 = uVar8;
  (this->Props).tol = dVar1;
  (this->Props).maxiter = sVar2;
  (this->Props).verbose = sVar3;
  (this->Props).maxiter = sVar4;
  (this->Props).verbose = sVar5;
  (this->Props).damping = dVar6;
  (this->Props).i = sVar7;
  this->_maxdiff = x->_maxdiff;
  this->_iterations = x->_iterations;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            (&this->_Qa,&x->_Qa);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            (&this->_Qb,&x->_Qb);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            (&this->_mes,&x->_mes);
  return;
}

Assistant:

IJGP & operator=( const IJGP & x ) {
                if( this != &x ) {
                    DAIAlgRG::operator=( x );
                    Props       = x.Props;
                    _maxdiff    = x._maxdiff;
                    _iterations = x._iterations;
                    _Qa         = x._Qa;
                    _Qb         = x._Qb;
                    _mes        = x._mes;
                }
                return *this;
            }